

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O1

StmNode * __thiscall Canonicalizer::visit(Canonicalizer *this,MOVE *node)

{
  int iVar1;
  Temp *this_00;
  Temp *this_01;
  MOVE *pMVar2;
  MOVE *pMVar3;
  TEMP *pTVar4;
  undefined4 extraout_var;
  SEQ *this_02;
  MOVE *this_03;
  undefined4 extraout_var_00;
  ExprNode *pEVar5;
  undefined4 extraout_var_01;
  StmNode *pSVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  if ((&node->src->super_StmNode == (StmNode *)0x0) ||
     (iVar1 = StmNode::getTypeStm(&node->src->super_StmNode), iVar1 != 7)) {
    if ((&node->dst->super_StmNode != (StmNode *)0x0) &&
       (iVar1 = StmNode::getTypeStm(&node->dst->super_StmNode), iVar1 == 7)) {
      this->changed = true;
      pMVar2 = (MOVE *)operator_new(0x20);
      iVar1 = (*(node->dst->super_StmNode).super_ICTNode._vptr_ICTNode[4])();
      pSVar6 = (StmNode *)
               (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x18))
                         ((long *)CONCAT44(extraout_var_02,iVar1),this);
      pMVar3 = (MOVE *)operator_new(0x20);
      iVar1 = (*(node->dst->super_StmNode).super_ICTNode._vptr_ICTNode[5])();
      pEVar5 = (ExprNode *)
               (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x18))
                         ((long *)CONCAT44(extraout_var_03,iVar1),this);
      iVar1 = (*(node->src->super_StmNode).super_ICTNode._vptr_ICTNode[3])(node->src,this);
      MOVE::MOVE(pMVar3,pEVar5,(ExprNode *)CONCAT44(extraout_var_04,iVar1));
      SEQ::SEQ((SEQ *)pMVar2,pSVar6,(StmNode *)pMVar3);
      node = pMVar2;
    }
  }
  else {
    this->changed = true;
    this_00 = (Temp *)operator_new(0x10);
    Temp::Temp(this_00);
    this_01 = (Temp *)operator_new(0x10);
    Temp::Temp(this_01);
    pMVar2 = (MOVE *)operator_new(0x20);
    pMVar3 = (MOVE *)operator_new(0x20);
    pTVar4 = (TEMP *)operator_new(0x18);
    TEMP::TEMP(pTVar4,this_00);
    iVar1 = (*(node->dst->super_StmNode).super_ICTNode._vptr_ICTNode[3])(node->dst,this);
    MOVE::MOVE(pMVar3,(ExprNode *)pTVar4,(ExprNode *)CONCAT44(extraout_var,iVar1));
    this_02 = (SEQ *)operator_new(0x20);
    this_03 = (MOVE *)operator_new(0x20);
    pTVar4 = (TEMP *)operator_new(0x18);
    TEMP::TEMP(pTVar4,this_01);
    iVar1 = (*(node->src->super_StmNode).super_ICTNode._vptr_ICTNode[5])();
    pEVar5 = (ExprNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x18))
                       ((long *)CONCAT44(extraout_var_00,iVar1),this);
    MOVE::MOVE(this_03,(ExprNode *)pTVar4,pEVar5);
    iVar1 = (*(node->src->super_StmNode).super_ICTNode._vptr_ICTNode[4])();
    pSVar6 = (StmNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x18))
                       ((long *)CONCAT44(extraout_var_01,iVar1),this);
    SEQ::SEQ(this_02,(StmNode *)this_03,pSVar6);
    SEQ::SEQ((SEQ *)pMVar2,(StmNode *)pMVar3,(StmNode *)this_02);
    node = pMVar2;
  }
  return &node->super_StmNode;
}

Assistant:

StmNode *Canonicalizer::visit(MOVE *node) {
    if (node->getSrc() && node->getSrc()->getTypeStm() == V_ESEQ) {
        changed = true;
        Temp * t = new Temp();
        Temp * t2 = new Temp();

        return new SEQ(new MOVE(new TEMP(t),node->getDst()->accept(this)),
                       new SEQ(new MOVE(new TEMP(t2),node->getSrc()->getE()->accept(this)),
                               node->getSrc()->getS()->accept(this)));

    }
    
    if (node->getDst() && node->getDst()->getTypeStm() == V_ESEQ) {
        changed = true;
        return new SEQ(node->getDst()->getS()->accept(this),
                       new MOVE(node->getDst()->getE()->accept(this), node->getSrc()->accept(this)));
    }
//    else {
//        if (node->getDst()) node->setDst(node->getDst()->accept(this));
//        if (node->getSrc()) node->setSrc(node->getSrc()->accept(this));
//    }

    return node;
}